

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbox.cpp
# Opt level: O1

void __thiscall QToolBox::setItemEnabled(QToolBox *this,int index,bool enabled)

{
  QToolBoxPrivate *this_00;
  bool bVar1;
  bool bVar2;
  Page *pPVar3;
  int index_00;
  int index_01;
  int iVar4;
  int index_02;
  
  this_00 = *(QToolBoxPrivate **)&(this->super_QFrame).super_QWidget.field_0x8;
  pPVar3 = QToolBoxPrivate::page(this_00,index);
  if (((pPVar3 == (Page *)0x0) || (QWidget::setEnabled((QWidget *)pPVar3->button,enabled), enabled))
     || (pPVar3 != this_00->currentPage)) {
    return;
  }
  iVar4 = (int)((ulong)((long)(this_00->pageList).
                              super__Vector_base<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>,_std::allocator<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this_00->pageList).
                             super__Vector_base<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>,_std::allocator<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 3) + -1;
  bVar1 = index < iVar4;
  bVar2 = 0 < index;
  index_01 = index;
  index_02 = index;
  if ((0 < index) || (index_00 = index, index < iVar4)) {
    do {
      if (bVar1) {
        index_02 = index_02 + 1;
        pPVar3 = QToolBoxPrivate::page(this_00,index_02);
        index_00 = index_02;
        if ((((pPVar3->button->super_QAbstractButton).super_QWidget.data)->widget_attributes & 1) ==
            0) break;
      }
      if (bVar2) {
        index_01 = index_01 + -1;
        pPVar3 = QToolBoxPrivate::page(this_00,index_01);
        index_00 = index_01;
        if ((((pPVar3->button->super_QAbstractButton).super_QWidget.data)->widget_attributes & 1) ==
            0) break;
      }
      bVar1 = index_02 < iVar4;
      bVar2 = 0 < index_01;
    } while ((0 < index_01) || (index_00 = index, index_02 < iVar4));
  }
  setCurrentIndex(this,index_00);
  return;
}

Assistant:

void QToolBox::setItemEnabled(int index, bool enabled)
{
    Q_D(QToolBox);
    QToolBoxPrivate::Page *c = d->page(index);
    if (!c)
        return;

    c->button->setEnabled(enabled);
    if (!enabled && c == d->currentPage) {
        int curIndexUp = index;
        int curIndexDown = curIndexUp;
        const int count = static_cast<int>(d->pageList.size());
        while (curIndexUp > 0 || curIndexDown < count-1) {
            if (curIndexDown < count-1) {
                if (d->page(++curIndexDown)->button->isEnabled()) {
                    index = curIndexDown;
                    break;
                }
            }
            if (curIndexUp > 0) {
                if (d->page(--curIndexUp)->button->isEnabled()) {
                    index = curIndexUp;
                    break;
                }
            }
        }
        setCurrentIndex(index);
    }
}